

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexes.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  int dims [3];
  char *local_b8;
  FmsInt local_b0;
  char filename [100];
  
  dims[0] = 3;
  dims[1] = 3;
  dims[2] = 3;
  local_b0 = 1;
  uVar3 = 1;
  if (argc < 2) {
    local_b8 = "ascii";
  }
  else {
    local_b8 = argv[1];
    if (argc != 2) {
      iVar1 = atoi(argv[2]);
      if (iVar1 == 0) {
        return -1;
      }
      local_b0 = (FmsInt)iVar1;
      if (5 < (uint)argc) {
        iVar1 = atoi(argv[3]);
        dims[0] = iVar1;
        iVar2 = atoi(argv[4]);
        dims[1] = iVar2;
        dims[2] = atoi(argv[5]);
        if (dims[2] < 2 || (iVar2 < 2 || iVar1 < 2)) {
          return -2;
        }
        if (argc != 6) {
          uVar3 = atoi(argv[6]);
        }
      }
    }
  }
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  dVar6 = 0.0;
  iVar1 = 0x4d2;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    if ((int)uVar3 < 2) {
      builtin_strncpy(filename,"hex.fms",8);
    }
    else {
      sprintf(filename,"hex%04d.fms",(ulong)uVar4);
    }
    WriteTimeStep(filename,local_b8,dims,local_b0,iVar1,dVar6 + 1.2345678);
    dVar6 = dVar6 + 1.0;
    iVar1 = iVar1 + 1000;
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[]) {
  int timestep = 0, nts = 1;
  const char *protocol = "ascii";
  char filename[100];
  int dims[3] = {3,3,3};
  FmsInt order = 1;

  /* Handle some command line args. */
  if(argc > 1) {
    protocol = argv[1];
    if(argc > 2) {
      order = atoi(argv[2]);
      if(order < 1)
        return -1;
      if(argc >= 6) {
        dims[0] = atoi(argv[3]);
        dims[1] = atoi(argv[4]);
        dims[2] = atoi(argv[5]);
        if(dims[0] < 2 || dims[1] < 2 || dims[2] < 2)
          return -2;
        if(argc >= 7)
          nts = atoi(argv[6]);
      }
    }
  }

  for(timestep = 0; timestep < nts; timestep++) {
    int cycle  = 1234 + 1000*timestep;
    double dtime = 1.2345678 + timestep;
    if(nts > 1)
      sprintf(filename, "hex%04d.fms", timestep);
    else
      strcpy(filename, "hex.fms");

    WriteTimeStep(filename, protocol, dims, order, cycle, dtime);
  }

  return 0;
}